

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
* __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::operator=(dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            *this,dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *ht)

{
  undefined8 uVar1;
  size_type sVar2;
  size_type sVar3;
  type pcVar4;
  type pcVar5;
  float fVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  empty_table;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_90;
  
  if (ht != this) {
    if ((ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
        use_empty_ == false) {
      dense_hashtable(&local_90,ht,0x20);
      swap(this,&local_90);
      if (local_90.table != (pointer)0x0) {
        free(local_90.table);
      }
    }
    else {
      iVar12 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
               super_Hasher.id_;
      iVar13 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
               super_Hasher.num_hashes_;
      uVar1 = *(undefined8 *)
               &(ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                super_Hasher.num_compares_;
      sVar2 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
              enlarge_threshold_;
      sVar3 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
              shrink_threshold_;
      fVar6 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
              shrink_factor_;
      bVar7 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
              consider_shrink_;
      bVar8 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
              use_empty_;
      bVar9 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
              use_deleted_;
      uVar10 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
               field_0x2b;
      uVar11 = (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
               num_ht_copies_;
      (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      enlarge_factor_ =
           (ht->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
           enlarge_factor_;
      (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      shrink_factor_ = fVar6;
      (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      consider_shrink_ = bVar7;
      (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      use_empty_ = bVar8;
      (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      use_deleted_ = bVar9;
      (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      field_0x2b = uVar10;
      (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      num_ht_copies_ = uVar11;
      (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      enlarge_threshold_ = sVar2;
      (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      shrink_threshold_ = sVar3;
      (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      super_Hasher.id_ = iVar12;
      (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      super_Hasher.num_hashes_ = iVar13;
      *(undefined8 *)
       &(this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
        super_Hasher.num_compares_ = uVar1;
      iVar12 = (ht->key_info).super_Hasher.num_hashes_;
      uVar1 = *(undefined8 *)&(ht->key_info).super_Hasher.num_compares_;
      pcVar4 = (ht->key_info).delkey;
      pcVar5 = (ht->key_info).empty_key;
      (this->key_info).super_Hasher.id_ = (ht->key_info).super_Hasher.id_;
      (this->key_info).super_Hasher.num_hashes_ = iVar12;
      *(undefined8 *)&(this->key_info).super_Hasher.num_compares_ = uVar1;
      (this->key_info).delkey = pcVar4;
      (this->key_info).empty_key = pcVar5;
      dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
      ::
      copy_or_move_from<google::dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>const&>
                ((dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                  *)this,ht,4);
    }
  }
  return this;
}

Assistant:

dense_hashtable& operator=(const dense_hashtable& ht) {
    if (&ht == this) return *this;  // don't copy onto ourselves
    if (!ht.settings.use_empty()) {
      assert(ht.empty());
      dense_hashtable empty_table(ht);  // empty table with ht's thresholds
      this->swap(empty_table);
      return *this;
    }
    settings = ht.settings;
    key_info = ht.key_info;
    // copy_or_move_from() calls clear and sets num_deleted to 0 too
    copy_or_move_from(ht, HT_MIN_BUCKETS);
    // we purposefully don't copy the allocator, which may not be copyable
    return *this;
  }